

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  double __y;
  float fVar1;
  double dVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double local_18;
  
  if (t <= 0.0) {
    return v_min;
  }
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      return (double)t * (v_max - v_min) + v_min;
    }
    if (1.0 <= t) {
      return 0.0;
    }
    return (v_max - v_min) * (double)t + *(double *)(&DAT_00201080 + (ulong)(v_max < v_min) * 8) +
           v_min;
  }
  local_18 = (double)logarithmic_zero_epsilon;
  dVar2 = v_min;
  if (ABS(v_min) < local_18) {
    fVar1 = logarithmic_zero_epsilon;
    if (v_min < 0.0) {
      fVar1 = -logarithmic_zero_epsilon;
    }
    dVar2 = (double)fVar1;
  }
  dVar4 = v_max;
  if (ABS(v_max) < local_18) {
    fVar1 = logarithmic_zero_epsilon;
    if (v_max < 0.0) {
      fVar1 = -logarithmic_zero_epsilon;
    }
    dVar4 = (double)fVar1;
  }
  dVar5 = dVar2;
  if (v_min <= v_max) {
    dVar5 = dVar4;
  }
  dVar2 = (double)(~-(ulong)(v_max < v_min) & (ulong)dVar2 | -(ulong)(v_max < v_min) & (ulong)dVar4)
  ;
  dVar4 = (double)((-(ulong)(v_max == 0.0) & (ulong)(double)-logarithmic_zero_epsilon |
                   ~-(ulong)(v_max == 0.0) & (ulong)dVar5) & -(ulong)(v_min < 0.0) |
                  ~-(ulong)(v_min < 0.0) & (ulong)dVar5);
  if (v_max < v_min) {
    t = 1.0 - t;
  }
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      dVar5 = dVar2 / dVar4;
      __y = (double)(1.0 - t);
      local_18 = dVar4;
    }
    else {
      dVar5 = dVar4 / dVar2;
      __y = (double)t;
      local_18 = dVar2;
    }
  }
  else {
    fVar1 = (float)v_min;
    if (v_max <= v_min) {
      v_min = v_max;
    }
    fVar3 = -(float)v_min / ABS((float)v_max - fVar1);
    fVar1 = zero_deadzone_halfsize + fVar3;
    if ((fVar3 - zero_deadzone_halfsize <= t) && (t <= fVar1)) {
      return 0.0;
    }
    if (t < fVar3) {
      dVar2 = pow(-dVar2 / local_18,(double)(1.0 - t / (fVar3 - zero_deadzone_halfsize)));
      dVar2 = -dVar2;
      goto LAB_001db234;
    }
    dVar5 = dVar4 / local_18;
    __y = (double)((t - fVar1) / (1.0 - fVar1));
  }
  dVar2 = pow(dVar5,__y);
LAB_001db234:
  return dVar2 * local_18;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}